

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O3

int cuddZddSifting(DdManager *table,int lower,int upper)

{
  uint initial_size;
  DdSubtable *pDVar1;
  int *piVar2;
  int iVar3;
  int *piVar4;
  void *__base;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  size_t sVar8;
  int iVar9;
  size_t __nmemb;
  DdNode *moves;
  long lVar10;
  
  iVar9 = table->sizeZ;
  __nmemb = (size_t)iVar9;
  piVar4 = (int *)malloc(__nmemb * 4);
  zdd_entry = piVar4;
  if (piVar4 == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    iVar9 = 0;
  }
  else {
    __base = malloc(__nmemb * 4);
    if (__base == (void *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
LAB_007febb5:
      if (zdd_entry != (int *)0x0) {
        free(zdd_entry);
        zdd_entry = (int *)0x0;
      }
      iVar9 = 0;
      if (__base != (void *)0x0) {
        free(__base);
        iVar9 = 0;
      }
    }
    else {
      if (0 < iVar9) {
        pDVar1 = table->subtableZ;
        piVar2 = table->permZ;
        sVar8 = 0;
        do {
          piVar4[sVar8] = pDVar1[piVar2[sVar8]].keys;
          *(int *)((long)__base + sVar8 * 4) = (int)sVar8;
          sVar8 = sVar8 + 1;
        } while (__nmemb != sVar8);
      }
      qsort(__base,__nmemb,4,cuddZddUniqueCompare);
      iVar3 = table->siftMaxVar;
      if (iVar9 < table->siftMaxVar) {
        iVar3 = iVar9;
      }
      if (0 < iVar3) {
        lVar10 = 0;
        do {
          if (table->siftMaxSwap <= zddTotalNumberSwapping) break;
          iVar3 = table->permZ[*(int *)((long)__base + lVar10 * 4)];
          if (iVar3 <= upper && lower <= iVar3) {
            initial_size = table->keysZ;
            if (iVar3 == lower) {
              pDVar5 = (DdNode *)cuddZddSiftingDown(table,lower,upper,initial_size);
              if (pDVar5 == (DdNode *)0x0) goto LAB_007febb5;
              iVar3 = cuddZddSiftingBackward(table,(Move *)pDVar5,initial_size);
              moves = (DdNode *)0x0;
LAB_007feaf6:
              if (iVar3 != 0) {
                pDVar7 = table->nextFree;
                do {
                  pDVar6 = pDVar5;
                  pDVar5 = (pDVar6->type).kids.T;
                  pDVar6->ref = 0;
                  pDVar6->next = pDVar7;
                  pDVar7 = pDVar6;
                } while (pDVar5 != (DdNode *)0x0);
                table->nextFree = pDVar6;
                if (moves != (DdNode *)0x0) goto LAB_007feb33;
                goto LAB_007feb54;
              }
LAB_007febfd:
              pDVar7 = table->nextFree;
              do {
                pDVar6 = pDVar5;
                pDVar5 = (pDVar6->type).kids.T;
                pDVar6->ref = 0;
                pDVar6->next = pDVar7;
                pDVar7 = pDVar6;
              } while (pDVar5 != (DdNode *)0x0);
              table->nextFree = pDVar6;
              if (moves == (DdNode *)0x0) goto LAB_007febb5;
            }
            else {
              if (upper != iVar3) {
                if (upper - iVar3 < iVar3 - lower) {
                  pDVar5 = (DdNode *)cuddZddSiftingDown(table,iVar3,upper,initial_size);
                  if (pDVar5 != (DdNode *)0x0) {
                    pDVar6 = (DdNode *)cuddZddSiftingUp(table,pDVar5->ref,lower,initial_size);
                    moves = pDVar6;
                    if (pDVar6 != (DdNode *)0x0) goto LAB_007feae7;
                    moves = (DdNode *)0x0;
                    goto LAB_007febfd;
                  }
                }
                else {
                  moves = (DdNode *)cuddZddSiftingUp(table,iVar3,lower,initial_size);
                  if (moves != (DdNode *)0x0) {
                    pDVar6 = (DdNode *)cuddZddSiftingDown(table,moves->index,upper,initial_size);
                    pDVar5 = pDVar6;
                    if (pDVar6 == (DdNode *)0x0) goto LAB_007febf1;
LAB_007feae7:
                    iVar3 = cuddZddSiftingBackward(table,(Move *)pDVar6,initial_size);
                    goto LAB_007feaf6;
                  }
                }
                goto LAB_007febb5;
              }
              moves = (DdNode *)cuddZddSiftingUp(table,upper,lower,initial_size);
              if (moves == (DdNode *)0x0) goto LAB_007febb5;
              iVar3 = cuddZddSiftingBackward(table,(Move *)moves,initial_size);
              if (iVar3 != 0) {
                pDVar6 = table->nextFree;
LAB_007feb33:
                do {
                  pDVar5 = moves;
                  moves = (pDVar5->type).kids.T;
                  pDVar5->ref = 0;
                  pDVar5->next = pDVar6;
                  pDVar6 = pDVar5;
                } while (moves != (DdNode *)0x0);
                table->nextFree = pDVar5;
                goto LAB_007feb54;
              }
LAB_007febf1:
              pDVar6 = table->nextFree;
            }
            do {
              pDVar5 = moves;
              moves = (pDVar5->type).kids.T;
              pDVar5->ref = 0;
              pDVar5->next = pDVar6;
              pDVar6 = pDVar5;
            } while (moves != (DdNode *)0x0);
            table->nextFree = pDVar5;
            goto LAB_007febb5;
          }
LAB_007feb54:
          lVar10 = lVar10 + 1;
          iVar3 = table->siftMaxVar;
          if (iVar9 < table->siftMaxVar) {
            iVar3 = iVar9;
          }
        } while (lVar10 < iVar3);
      }
      free(__base);
      iVar9 = 1;
      if (zdd_entry != (int *)0x0) {
        free(zdd_entry);
        zdd_entry = (int *)0x0;
      }
    }
  }
  return iVar9;
}

Assistant:

int
cuddZddSifting(
  DdManager * table,
  int  lower,
  int  upper)
{
    int i;
    int *var;
    int size;
    int x;
    int result;
#ifdef DD_STATS
    int previousSize;
#endif

    size = table->sizeZ;

    /* Find order in which to sift variables. */
    var = NULL;
    zdd_entry = ABC_ALLOC(int, size);
    if (zdd_entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSiftingOutOfMem;
    }
    var = ABC_ALLOC(int, size);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSiftingOutOfMem;
    }

    for (i = 0; i < size; i++) {
        x = table->permZ[i];
        zdd_entry[i] = table->subtableZ[x].keys;
        var[i] = i;
    }

    qsort((void *)var, size, sizeof(int), (DD_QSFP)cuddZddUniqueCompare);

    /* Now sift. */
    for (i = 0; i < ddMin(table->siftMaxVar, size); i++) {
        if (zddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        x = table->permZ[var[i]];
        if (x < lower || x > upper) continue;
#ifdef DD_STATS
        previousSize = table->keysZ;
#endif
        result = cuddZddSiftingAux(table, x, lower, upper);
        if (!result)
            goto cuddZddSiftingOutOfMem;
#ifdef DD_STATS
        if (table->keysZ < (unsigned) previousSize) {
            (void) fprintf(table->out,"-");
        } else if (table->keysZ > (unsigned) previousSize) {
            (void) fprintf(table->out,"+");     /* should never happen */
            (void) fprintf(table->out,"\nSize increased from %d to %d while sifting variable %d\n", previousSize, table->keysZ , var[i]);
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
    }

    ABC_FREE(var);
    ABC_FREE(zdd_entry);

    return(1);

cuddZddSiftingOutOfMem:

    if (zdd_entry != NULL) ABC_FREE(zdd_entry);
    if (var != NULL) ABC_FREE(var);

    return(0);

}